

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall coins_tests::ccoins_spend::test_method(ccoins_spend *this)

{
  long lVar1;
  long in_FS_OFFSET;
  char unaff_retaddr;
  CAmount in_stack_00000008;
  CAmount in_stack_00000010;
  char in_stack_000000cf;
  CAmount in_stack_000000d0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  CheckSpendCoins(in_stack_00000010,in_stack_00000008,in_stack_000000d0,unaff_retaddr,
                  in_stack_000000cf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_spend)
{
    /* Check SpendCoin behavior, requesting a coin from a cache view layered on
     * top of a base view, spending, and then checking
     * the resulting entry in the cache after the modification.
     *
     *              Base    Cache   Result  Cache        Result
     *              Value   Value   Value   Flags        Flags
     */
    CheckSpendCoins(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckSpendCoins(ABSENT, SPENT , SPENT , 0          , DIRTY      );
    CheckSpendCoins(ABSENT, SPENT , ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(ABSENT, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(ABSENT, SPENT , ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(ABSENT, VALUE2, SPENT , 0          , DIRTY      );
    CheckSpendCoins(ABSENT, VALUE2, ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(ABSENT, VALUE2, SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(ABSENT, VALUE2, ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(SPENT , ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckSpendCoins(SPENT , SPENT , SPENT , 0          , DIRTY      );
    CheckSpendCoins(SPENT , SPENT , ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(SPENT , VALUE2, SPENT , 0          , DIRTY      );
    CheckSpendCoins(SPENT , VALUE2, ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(SPENT , VALUE2, SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(SPENT , VALUE2, ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(VALUE1, ABSENT, SPENT , NO_ENTRY   , DIRTY      );
    CheckSpendCoins(VALUE1, SPENT , SPENT , 0          , DIRTY      );
    CheckSpendCoins(VALUE1, SPENT , ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(VALUE1, SPENT , ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(VALUE1, VALUE2, SPENT , 0          , DIRTY      );
    CheckSpendCoins(VALUE1, VALUE2, ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(VALUE1, VALUE2, SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(VALUE1, VALUE2, ABSENT, DIRTY|FRESH, NO_ENTRY   );
}